

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

int __thiscall llvm::APInt::compareSigned(APInt *this,APInt *RHS)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  
  uVar3 = this->BitWidth;
  if (uVar3 != RHS->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be same for comparison\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x11b,"int llvm::APInt::compareSigned(const APInt &) const");
  }
  if (uVar3 < 0x41) {
    iVar5 = SignExtend64((this->U).VAL,uVar3);
    iVar6 = SignExtend64((RHS->U).VAL,this->BitWidth);
    uVar3 = 0xffffffff;
    if (iVar6 <= iVar5) {
      uVar3 = (uint)(iVar6 < iVar5);
    }
  }
  else {
    bVar1 = isNegative(this);
    bVar2 = isNegative(RHS);
    if (bVar1 == bVar2) {
      iVar4 = tcCompare((this->U).pVal,(RHS->U).pVal,(uint)((ulong)this->BitWidth + 0x3f >> 6));
      return iVar4;
    }
    uVar3 = -(uint)bVar1 | 1;
  }
  return uVar3;
}

Assistant:

int APInt::compareSigned(const APInt& RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be same for comparison");
  if (isSingleWord()) {
    int64_t lhsSext = SignExtend64(U.VAL, BitWidth);
    int64_t rhsSext = SignExtend64(RHS.U.VAL, BitWidth);
    return lhsSext < rhsSext ? -1 : lhsSext > rhsSext;
  }

  bool lhsNeg = isNegative();
  bool rhsNeg = RHS.isNegative();

  // If the sign bits don't match, then (LHS < RHS) if LHS is negative
  if (lhsNeg != rhsNeg)
    return lhsNeg ? -1 : 1;

  // Otherwise we can just use an unsigned comparison, because even negative
  // numbers compare correctly this way if both have the same signed-ness.
  return tcCompare(U.pVal, RHS.U.pVal, getNumWords());
}